

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::
get_match_positions_component_prefix_dirpath
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns)

{
  bool bVar1;
  const_iterator query_last;
  iterator_type item_first_00;
  iterator_type this_00;
  iterator_type posns_00;
  vector<char,_std::allocator<char>_> *in_RSI;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *in_RDI;
  iterator_type query_pc_last;
  const_reverse_iterator query_rlast;
  ReverseIterator query_rit;
  const_iterator item_first;
  const_reverse_iterator item_rlast;
  ReverseIterator item_rit;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  iterator_type __x;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *pMVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_28;
  char *local_20;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  local_20 = in_RDI[4].current._M_current;
  local_10 = in_RSI;
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  ::reverse_iterator(&local_18,(iterator_type)local_20);
  std::vector<char,_std::allocator<char>_>::crend(in_stack_ffffffffffffff78);
  query_last = std::vector<char,_std::allocator<char>_>::cbegin(in_stack_ffffffffffffff68);
  __x._M_current = in_RDI[8].current._M_current;
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffc8,__x);
  std::vector<char,_std::allocator<char>_>::crend(in_stack_ffffffffffffff78);
  item_first_00 =
       std::
       reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
       ::base((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,(reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                                    *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffffa8,&local_28);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffffa0,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffffb8);
    consume_path_component_match_front
              ((Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *)query_last._M_current,
               (ReverseIterator *)in_stack_ffffffffffffffc8._M_current,
               (ReverseIterator *)__x._M_current,
               (ReverseIterator *)in_stack_ffffffffffffffb8._M_current,
               (ReverseIterator *)item_first_00._M_current);
    in_stack_ffffffffffffff68 = local_10;
    pMVar2 = (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *)query_last._M_current;
    this_00 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
              ::base(&local_18);
    posns_00 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
               ::base((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                       *)&stack0xffffffffffffffc8);
    Matcher<cpsm::NonPathTraits,cpsm::SimpleStringTraits>::
    get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *)this_00._M_current,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)posns_00._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               item_first_00._M_current,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               query_last._M_current);
    item_first_00 =
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
         ::base((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffffc8);
    query_last._M_current = (char *)pMVar2;
  }
  return;
}

Assistant:

void get_match_positions_component_prefix_dirpath(
      std::vector<std::size_t>& posns) const {
    auto item_rit = ReverseIterator(item_basename_);
    auto const item_rlast = item_.crend();
    auto const item_first = item_.cbegin();
    auto query_rit = ReverseIterator(qit_basename_);
    auto const query_rlast = query_.crend();
    auto query_pc_last = query_rit.base();

    while (query_rit != query_rlast) {
      consume_path_component_match_front(item_rit, item_rlast, query_rit,
                                         query_rlast);
      get_match_positions_greedy(posns, item_first, item_rit.base(),
                                 query_rit.base(), query_pc_last);
      query_pc_last = query_rit.base();
    }
  }